

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O1

bool __thiscall
expression_tree::detail::
default_branch<float,_expression_tree::no_caching,_expression_tree::sequential>::constant
          (default_branch<float,_expression_tree::no_caching,_expression_tree::sequential> *this)

{
  node_impl<float> *pnVar1;
  int iVar2;
  constness_e cVar3;
  
  if (this->constant_ == indeterminate) {
    pnVar1 = (this->l).impl._M_t.
             super___uniq_ptr_impl<expression_tree::detail::node_impl<float>,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_expression_tree::detail::node_impl<float>_*,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
             .super__Head_base<0UL,_expression_tree::detail::node_impl<float>_*,_false>._M_head_impl
    ;
    cVar3 = false_;
    if (pnVar1 != (node_impl<float> *)0x0) {
      iVar2 = (*pnVar1->_vptr_node_impl[3])();
      if (((char)iVar2 != '\0') &&
         (pnVar1 = (this->r).impl._M_t.
                   super___uniq_ptr_impl<expression_tree::detail::node_impl<float>,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_expression_tree::detail::node_impl<float>_*,_std::default_delete<expression_tree::detail::node_impl<float>_>_>
                   .super__Head_base<0UL,_expression_tree::detail::node_impl<float>_*,_false>.
                   _M_head_impl, pnVar1 != (node_impl<float> *)0x0)) {
        iVar2 = (*pnVar1->_vptr_node_impl[3])();
        cVar3 = (constness_e)iVar2 ^ false_;
      }
    }
    this->constant_ = cVar3;
  }
  return this->constant_ == true_;
}

Assistant:

virtual bool constant() const override
	{
        if(constant_ == indeterminate)
        {
            constant_ = (l.constant() && r.constant()) ? true_ : false_;
        }

		return constant_ == true_;
	}